

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

void __thiscall
Cache::Cache(Cache *this,MemoryManager *manager,Policy policy,Cache *lower_cache,bool write_back,
            bool write_allocate,uint32_t mct_size)

{
  bool bVar1;
  byte in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  byte in_R8B;
  undefined4 in_R9D;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined4 in_stack_00000018;
  Cache *this_00;
  
  this_00 = (Cache *)(in_RDI + 6);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::vector
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)0x105bc9);
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  *(undefined8 *)(in_RDI + 0x12) = 0;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  *(undefined8 *)(in_RDI + 0x16) = 0;
  in_RDI[0x18] = 0;
  *(undefined1 *)(in_RDI + 0x19) = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  *(undefined8 *)(in_RDI + 2) = in_RSI;
  in_RDI[0x18] = in_R9D;
  *(undefined8 *)(in_RDI + 0xc) = in_stack_00000008;
  *(undefined8 *)(in_RDI + 0xe) = in_stack_00000010;
  in_RDI[0x10] = in_stack_00000018;
  *(undefined8 *)(in_RDI + 4) = in_RDX;
  *in_RDI = 0;
  bVar1 = policyValid(this_00);
  if (!bVar1) {
    fprintf(_stderr,"Policy invalid\n");
    exit(-1);
  }
  initCache((Cache *)policy._0_8_);
  *(byte *)((long)in_RDI + 5) = in_R8B & 1;
  *(byte *)(in_RDI + 1) = in_CL & 1;
  return;
}

Assistant:

Cache::Cache(MemoryManager *manager, Policy policy, Cache *lower_cache,
             bool write_back, bool write_allocate, uint32_t mct_size) {
    this->memory = manager;
    this->mct_size = mct_size;
    this->policy = policy;
    this->lower_cache = lower_cache;
    this->reference_cnt = 0;
    if (!this->policyValid()) {
        fprintf(stderr, "Policy invalid\n");
        exit(-1);
    }
    this->initCache();
    this->write_allocate = write_allocate;
    this->write_back = write_back;
}